

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

void ReplaceReservedXmlCharacters(char *input,char *output)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char tempString [8192];
  
  if (output != (char *)0x0 && input != (char *)0x0) {
    strcpy(output,input);
    pcVar1 = output;
    while (pcVar1 = strchr(pcVar1,0x26), pcVar3 = output, pcVar1 != (char *)0x0) {
      tempString[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(tempString,pcVar1 + 1);
      }
      sprintf(pcVar1,"&amp;%s",tempString);
    }
    while (pcVar3 = strchr(pcVar3,0x3c), pcVar1 = output, pcVar3 != (char *)0x0) {
      tempString[0] = '\0';
      sVar2 = strlen(pcVar3);
      if (1 < sVar2) {
        strcpy(tempString,pcVar3 + 1);
      }
      sprintf(pcVar3,"&lt;%s",tempString);
    }
    while (pcVar1 = strchr(pcVar1,0x3e), pcVar3 = output, pcVar1 != (char *)0x0) {
      tempString[0] = '\0';
      sVar2 = strlen(pcVar1);
      if (1 < sVar2) {
        strcpy(tempString,pcVar1 + 1);
      }
      sprintf(pcVar1,"&gt;%s",tempString);
    }
    while (pcVar3 = strchr(pcVar3,0x27), pcVar3 != (char *)0x0) {
      tempString[0] = '\0';
      sVar2 = strlen(pcVar3);
      if (1 < sVar2) {
        strcpy(tempString,pcVar3 + 1);
      }
      sprintf(pcVar3,"&apos;%s",tempString);
    }
    while (output = strchr(output,0x22), output != (char *)0x0) {
      tempString[0] = '\0';
      sVar2 = strlen(output);
      if (1 < sVar2) {
        strcpy(tempString,output + 1);
      }
      sprintf(output,"&quot;%s",tempString);
    }
  }
  return;
}

Assistant:

static void ReplaceReservedXmlCharacters(const char *input, char *output )
{
	char *currentPosition;
	char tempString[8*1024];

	if((input == NULL) || (output == NULL))
	{
		return;
	}

	strcpy(output, input);

	/*Replace '&' with "&amp;"
	 *Note1: '&' has to be processed first as otherwise we replace the
	 *       '&' in the escaped characters.
	 *Note2: We assume that the input string does not have any escaped
	 *       characters already.
     */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '&')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&amp;%s", tempString);
	}

	/* Replace '<' with "&lt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '<')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&lt;%s", tempString);
	}

	/* Replace '>' with "&gt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '>')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&gt;%s", tempString);
	}

    /* Replace ''' with "&apos;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '\'')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&apos;%s", tempString);
	}

	/* Replace '"' with "&quot;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '"')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&quot;%s", tempString);
	}
}